

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedModel.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::LinkedModel::clear_LinkType(LinkedModel *this)

{
  if ((this->_oneof_case_[0] == 1) && ((this->LinkType_).linkedmodelfile_ != (LinkedModelFile *)0x0)
     ) {
    (*(((this->LinkType_).linkedmodelfile_)->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void LinkedModel::clear_LinkType() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.LinkedModel)
  switch (LinkType_case()) {
    case kLinkedModelFile: {
      delete LinkType_.linkedmodelfile_;
      break;
    }
    case LINKTYPE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = LINKTYPE_NOT_SET;
}